

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cuddLevelQ.c
# Opt level: O0

DdLevelQueue * cuddLevelQueueInit(int levels,int itemSize,int numBuckets)

{
  int iVar1;
  DdQueueItem **ppDVar2;
  int logSize;
  DdLevelQueue *queue;
  int numBuckets_local;
  int itemSize_local;
  int levels_local;
  
  _itemSize_local = (DdLevelQueue *)malloc(0x38);
  if (_itemSize_local == (DdLevelQueue *)0x0) {
    _itemSize_local = (DdLevelQueue *)0x0;
  }
  else {
    ppDVar2 = (DdQueueItem **)malloc((long)levels << 3);
    _itemSize_local->last = ppDVar2;
    if (_itemSize_local->last == (DdQueueItem **)0x0) {
      if (_itemSize_local != (DdLevelQueue *)0x0) {
        free(_itemSize_local);
      }
      _itemSize_local = (DdLevelQueue *)0x0;
    }
    else {
      queue._4_4_ = numBuckets;
      if (numBuckets < 2) {
        queue._4_4_ = 2;
      }
      iVar1 = cuddComputeFloorLog2(queue._4_4_);
      _itemSize_local->numBuckets = 1 << ((byte)iVar1 & 0x1f);
      _itemSize_local->shift = 0x20 - iVar1;
      ppDVar2 = (DdQueueItem **)malloc((long)_itemSize_local->numBuckets << 3);
      _itemSize_local->buckets = ppDVar2;
      if (_itemSize_local->buckets == (DdQueueItem **)0x0) {
        if (_itemSize_local->last != (DdQueueItem **)0x0) {
          free(_itemSize_local->last);
          _itemSize_local->last = (DdQueueItem **)0x0;
        }
        if (_itemSize_local != (DdLevelQueue *)0x0) {
          free(_itemSize_local);
        }
        _itemSize_local = (DdLevelQueue *)0x0;
      }
      else {
        memset(_itemSize_local->last,0,(long)levels << 3);
        memset(_itemSize_local->buckets,0,(long)_itemSize_local->numBuckets << 3);
        _itemSize_local->first = (void *)0x0;
        _itemSize_local->freelist = (DdQueueItem *)0x0;
        _itemSize_local->levels = levels;
        _itemSize_local->itemsize = itemSize;
        _itemSize_local->size = 0;
        _itemSize_local->maxsize = _itemSize_local->numBuckets << 2;
      }
    }
  }
  return _itemSize_local;
}

Assistant:

DdLevelQueue *
cuddLevelQueueInit(
  int  levels /* number of levels */,
  int  itemSize /* size of the item */,
  int  numBuckets /* initial number of hash buckets */)
{
    DdLevelQueue *queue;
    int logSize;

    queue = ABC_ALLOC(DdLevelQueue,1);
    if (queue == NULL)
        return(NULL);
#ifdef __osf__
#pragma pointer_size save
#pragma pointer_size short
#endif
    /* Keep pointers to the insertion points for all levels. */
    queue->last = ABC_ALLOC(DdQueueItem *, levels);
#ifdef __osf__
#pragma pointer_size restore
#endif
    if (queue->last == NULL) {
        ABC_FREE(queue);
        return(NULL);
    }
    /* Use a hash table to test for uniqueness. */
    if (numBuckets < 2) numBuckets = 2;
    logSize = cuddComputeFloorLog2(numBuckets);
    queue->numBuckets = 1 << logSize;
    queue->shift = sizeof(int) * 8 - logSize;
#ifdef __osf__
#pragma pointer_size save
#pragma pointer_size short
#endif
    queue->buckets = ABC_ALLOC(DdQueueItem *, queue->numBuckets);
#ifdef __osf__
#pragma pointer_size restore
#endif
    if (queue->buckets == NULL) {
        ABC_FREE(queue->last);
        ABC_FREE(queue);
        return(NULL);
    }
#ifdef __osf__
#pragma pointer_size save
#pragma pointer_size short
#endif
    memset(queue->last, 0, levels * sizeof(DdQueueItem *));
    memset(queue->buckets, 0, queue->numBuckets * sizeof(DdQueueItem *));
#ifdef __osf__
#pragma pointer_size restore
#endif
    queue->first = NULL;
    queue->freelist = NULL;
    queue->levels = levels;
    queue->itemsize = itemSize;
    queue->size = 0;
    queue->maxsize = queue->numBuckets * DD_MAX_SUBTABLE_DENSITY;
    return(queue);

}